

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5PoslistPopulator * sqlite3Fts5ExprClearPoslists(Fts5Expr *pExpr,int bLive)

{
  Fts5ExprNode *pFVar1;
  Fts5PoslistPopulator *__s;
  Fts5ExprNode *pNode;
  Fts5Buffer *pBuf;
  int i;
  Fts5PoslistPopulator *pRet;
  int bLive_local;
  Fts5Expr *pExpr_local;
  
  __s = (Fts5PoslistPopulator *)sqlite3_malloc64((long)pExpr->nPhrase << 4);
  if (__s != (Fts5PoslistPopulator *)0x0) {
    memset(__s,0,(long)pExpr->nPhrase << 4);
    for (pBuf._4_4_ = 0; pBuf._4_4_ < pExpr->nPhrase; pBuf._4_4_ = pBuf._4_4_ + 1) {
      pFVar1 = pExpr->apExprPhrase[pBuf._4_4_]->pNode;
      if ((bLive == 0) ||
         ((((pExpr->apExprPhrase[pBuf._4_4_]->poslist).n != 0 &&
           (pFVar1->iRowid == pExpr->pRoot->iRowid)) && (pFVar1->bEof == 0)))) {
        (pExpr->apExprPhrase[pBuf._4_4_]->poslist).n = 0;
      }
      else {
        __s[pBuf._4_4_].bMiss = 1;
      }
    }
  }
  return __s;
}

Assistant:

static Fts5PoslistPopulator *sqlite3Fts5ExprClearPoslists(Fts5Expr *pExpr, int bLive){
  Fts5PoslistPopulator *pRet;
  pRet = sqlite3_malloc64(sizeof(Fts5PoslistPopulator)*pExpr->nPhrase);
  if( pRet ){
    int i;
    memset(pRet, 0, sizeof(Fts5PoslistPopulator)*pExpr->nPhrase);
    for(i=0; i<pExpr->nPhrase; i++){
      Fts5Buffer *pBuf = &pExpr->apExprPhrase[i]->poslist;
      Fts5ExprNode *pNode = pExpr->apExprPhrase[i]->pNode;
      assert( pExpr->apExprPhrase[i]->nTerm==1 );
      if( bLive && 
          (pBuf->n==0 || pNode->iRowid!=pExpr->pRoot->iRowid || pNode->bEof)
      ){
        pRet[i].bMiss = 1;
      }else{
        pBuf->n = 0;
      }
    }
  }
  return pRet;
}